

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O3

int __thiscall
zmq::router_t::get_peer_state(router_t *this,void *routing_id_,size_t routing_id_size_)

{
  bool bVar1;
  out_pipe_t *poVar2;
  int *piVar3;
  int iVar4;
  blob_t routing_id_blob;
  blob_t local_20;
  
  local_20._owned = false;
  local_20._data = (uchar *)routing_id_;
  local_20._size = routing_id_size_;
  poVar2 = routing_socket_base_t::lookup_out_pipe(&this->super_routing_socket_base_t,&local_20);
  if (poVar2 == (out_pipe_t *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0x71;
    iVar4 = -1;
  }
  else {
    bVar1 = pipe_t::check_hwm(poVar2->pipe);
    iVar4 = (uint)bVar1 * 2;
  }
  if (local_20._owned == true) {
    free(local_20._data);
  }
  return iVar4;
}

Assistant:

int zmq::router_t::get_peer_state (const void *routing_id_,
                                   size_t routing_id_size_) const
{
    int res = 0;

    // TODO remove the const_cast, see comment in lookup_out_pipe
    const blob_t routing_id_blob (
      static_cast<unsigned char *> (const_cast<void *> (routing_id_)),
      routing_id_size_, reference_tag_t ());
    const out_pipe_t *out_pipe = lookup_out_pipe (routing_id_blob);
    if (!out_pipe) {
        errno = EHOSTUNREACH;
        return -1;
    }

    if (out_pipe->pipe->check_hwm ())
        res |= ZMQ_POLLOUT;

    /** \todo does it make any sense to check the inpipe as well? */

    return res;
}